

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void finish_pass_gather(j_compress_ptr cinfo)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JHUFF_TBL *pJVar3;
  long lVar4;
  long lVar5;
  boolean did_ac [4];
  boolean did_dc [4];
  int local_48 [8];
  
  pjVar2 = cinfo->entropy;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  for (lVar5 = 0; lVar5 < cinfo->comps_in_scan; lVar5 = lVar5 + 1) {
    lVar4 = (long)cinfo->cur_comp_info[lVar5]->dc_tbl_no;
    iVar1 = cinfo->cur_comp_info[lVar5]->ac_tbl_no;
    if (local_48[lVar4 + 4] == 0) {
      pJVar3 = cinfo->dc_huff_tbl_ptrs[lVar4];
      if (pJVar3 == (JHUFF_TBL *)0x0) {
        pJVar3 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
        cinfo->dc_huff_tbl_ptrs[lVar4] = pJVar3;
      }
      jpeg_gen_optimal_table(cinfo,pJVar3,(long *)(&pjVar2[5].encode_mcu)[lVar4]);
      local_48[lVar4 + 4] = 1;
    }
    if (local_48[iVar1] == 0) {
      pJVar3 = cinfo->ac_huff_tbl_ptrs[iVar1];
      if (pJVar3 == (JHUFF_TBL *)0x0) {
        pJVar3 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
        cinfo->ac_huff_tbl_ptrs[iVar1] = pJVar3;
      }
      jpeg_gen_optimal_table(cinfo,pJVar3,(long *)(&pjVar2[6].finish_pass)[iVar1]);
      local_48[iVar1] = 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
finish_pass_gather(j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  int ci, dctbl, actbl;
  jpeg_component_info *compptr;
  JHUFF_TBL **htblptr;
  boolean did_dc[NUM_HUFF_TBLS];
  boolean did_ac[NUM_HUFF_TBLS];

  /* It's important not to apply jpeg_gen_optimal_table more than once
   * per table, because it clobbers the input frequency counts!
   */
  MEMZERO(did_dc, sizeof(did_dc));
  MEMZERO(did_ac, sizeof(did_ac));

  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    dctbl = compptr->dc_tbl_no;
    actbl = compptr->ac_tbl_no;
    if (!did_dc[dctbl]) {
      htblptr = &cinfo->dc_huff_tbl_ptrs[dctbl];
      if (*htblptr == NULL)
        *htblptr = jpeg_alloc_huff_table((j_common_ptr)cinfo);
      jpeg_gen_optimal_table(cinfo, *htblptr, entropy->dc_count_ptrs[dctbl]);
      did_dc[dctbl] = TRUE;
    }
    if (!did_ac[actbl]) {
      htblptr = &cinfo->ac_huff_tbl_ptrs[actbl];
      if (*htblptr == NULL)
        *htblptr = jpeg_alloc_huff_table((j_common_ptr)cinfo);
      jpeg_gen_optimal_table(cinfo, *htblptr, entropy->ac_count_ptrs[actbl]);
      did_ac[actbl] = TRUE;
    }
  }
}